

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O1

REF_STATUS ref_search_dist3(REF_DBL *a,REF_DBL *b,REF_DBL *c,REF_DBL *p,REF_DBL *distance)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined8 uVar4;
  char *pcVar5;
  REF_DBL RVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  
  dVar9 = *b;
  dVar23 = b[1];
  dVar15 = *a;
  dVar17 = a[1];
  dVar16 = dVar9 - dVar15;
  dVar19 = dVar23 - dVar17;
  dVar20 = b[2];
  dVar12 = a[2];
  dVar21 = dVar20 - dVar12;
  dVar25 = *p;
  dVar10 = p[1];
  dVar13 = dVar25 - dVar15;
  dVar26 = dVar10 - dVar17;
  dVar7 = p[2];
  dVar8 = dVar7 - dVar12;
  dVar22 = dVar21 * dVar8 + dVar16 * dVar13 + dVar19 * dVar26;
  dVar1 = *c;
  dVar18 = dVar1 - dVar15;
  dVar2 = c[1];
  dVar24 = dVar2 - dVar17;
  dVar3 = c[2];
  dVar11 = dVar3 - dVar12;
  dVar29 = dVar11 * dVar8 + dVar18 * dVar13 + dVar24 * dVar26;
  if ((0.0 < dVar22) || (0.0 < dVar29)) {
    dVar27 = dVar25 - dVar9;
    dVar26 = dVar10 - dVar23;
    dVar8 = dVar7 - dVar20;
    dVar30 = dVar21 * dVar8 + dVar16 * dVar27 + dVar19 * dVar26;
    dVar13 = dVar11 * dVar8 + dVar18 * dVar27 + dVar24 * dVar26;
    if ((0.0 <= dVar30) && (dVar13 <= dVar30)) {
      dVar9 = dVar8 * dVar8 + dVar27 * dVar27 + dVar26 * dVar26;
      goto LAB_00181961;
    }
    dVar8 = dVar22 * dVar13 - dVar29 * dVar30;
    if (((-dVar30 < dVar30) || (dVar22 < 0.0)) || (0.0 < dVar8)) {
      dVar31 = dVar25 - dVar1;
      dVar14 = dVar10 - dVar2;
      dVar27 = dVar7 - dVar3;
      dVar26 = dVar21 * dVar27 + dVar16 * dVar31 + dVar19 * dVar14;
      dVar28 = dVar11 * dVar27 + dVar18 * dVar31 + dVar24 * dVar14;
      if ((0.0 <= dVar28) && (dVar26 <= dVar28)) {
        dVar9 = dVar27 * dVar27 + dVar31 * dVar31 + dVar14 * dVar14;
        goto LAB_00181961;
      }
      dVar22 = dVar26 * dVar29 - dVar22 * dVar28;
      if (((0.0 < dVar28) || (0.0 < dVar22)) || (dVar29 < 0.0)) {
        dVar29 = dVar30 * dVar28 - dVar13 * dVar26;
        if (((0.0 < dVar29) || (dVar13 = dVar13 - dVar30, dVar13 < 0.0)) || (dVar26 - dVar28 < 0.0))
        {
          dVar23 = dVar29 + dVar22 + dVar8;
          dVar9 = dVar23 * 1e+20;
          if (dVar9 <= -dVar9) {
            dVar9 = -dVar9;
          }
          dVar20 = dVar22;
          if (dVar22 <= -dVar22) {
            dVar20 = -dVar22;
          }
          if (dVar9 <= dVar20) {
            pcVar5 = "div zero vb / (va + vb + vc)";
            uVar4 = 0x2a1;
LAB_00181b5a:
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c"
                   ,uVar4,"ref_search_dist3",pcVar5);
            return 1;
          }
          dVar20 = dVar8;
          if (dVar8 <= -dVar8) {
            dVar20 = -dVar8;
          }
          if (dVar9 <= dVar20) {
            pcVar5 = "div zero vc / (va + vb + vc)";
            uVar4 = 0x2a3;
            goto LAB_00181b5a;
          }
          dVar22 = dVar22 / dVar23;
          dVar8 = dVar8 / dVar23;
          dVar25 = dVar25 - (dVar18 * dVar8 + dVar16 * dVar22 + dVar15);
          dVar10 = dVar10 - (dVar24 * dVar8 + dVar19 * dVar22 + dVar17);
          dVar9 = dVar25 * dVar25 + dVar10 * dVar10;
          dVar7 = dVar7 - (dVar8 * dVar11 + dVar22 * dVar21 + dVar12);
        }
        else {
          dVar17 = (dVar26 - dVar28) + dVar13;
          dVar15 = dVar17 * 1e+20;
          if (dVar15 <= -dVar15) {
            dVar15 = -dVar15;
          }
          dVar12 = dVar13;
          if (dVar13 <= -dVar13) {
            dVar12 = -dVar13;
          }
          if (dVar15 <= dVar12) {
            pcVar5 = "div zero (d4 - d3) / ((d4 - d3) + (d5 - d6))";
            uVar4 = 0x296;
            goto LAB_00181b5a;
          }
          dVar13 = dVar13 / dVar17;
          dVar25 = dVar25 - ((dVar1 - dVar9) * dVar13 + dVar9);
          dVar10 = dVar10 - ((dVar2 - dVar23) * dVar13 + dVar23);
          dVar9 = dVar25 * dVar25 + dVar10 * dVar10;
          dVar7 = dVar7 - ((dVar3 - dVar20) * dVar13 + dVar20);
        }
        goto LAB_00181a64;
      }
      dVar9 = (dVar29 - dVar28) * 1e+20;
      if (dVar9 <= -dVar9) {
        dVar9 = -dVar9;
      }
      dVar23 = dVar29;
      if (dVar29 <= -dVar29) {
        dVar23 = -dVar29;
      }
      if (dVar9 <= dVar23) {
        pcVar5 = "div zero d2/(d2-d6)";
        uVar4 = 0x287;
        goto LAB_00181b5a;
      }
      dVar29 = dVar29 / (dVar29 - dVar28);
      dVar25 = dVar25 - (dVar18 * dVar29 + dVar15);
      dVar10 = dVar10 - (dVar24 * dVar29 + dVar17);
      dVar7 = dVar7 - (dVar29 * dVar11 + dVar12);
      dVar9 = dVar7 * dVar7 + dVar25 * dVar25 + dVar10 * dVar10;
    }
    else {
      dVar9 = (dVar22 - dVar30) * 1e+20;
      if (dVar9 <= -dVar9) {
        dVar9 = -dVar9;
      }
      dVar23 = dVar22;
      if (dVar22 <= -dVar22) {
        dVar23 = -dVar22;
      }
      if (dVar9 <= dVar23) {
        pcVar5 = "div zero d1/(d1-d3)";
        uVar4 = 0x26c;
        goto LAB_00181b5a;
      }
      dVar22 = dVar22 / (dVar22 - dVar30);
      dVar25 = dVar25 - (dVar16 * dVar22 + dVar15);
      dVar10 = dVar10 - (dVar19 * dVar22 + dVar17);
      dVar9 = dVar25 * dVar25 + dVar10 * dVar10;
      dVar7 = dVar7 - (dVar22 * dVar21 + dVar12);
LAB_00181a64:
      dVar9 = dVar7 * dVar7 + dVar9;
    }
    if (0.0 <= dVar9) {
      RVar6 = SQRT(dVar9);
      goto LAB_0018197d;
    }
  }
  else {
    dVar9 = dVar8 * dVar8 + dVar13 * dVar13 + dVar26 * dVar26;
LAB_00181961:
    if (0.0 <= dVar9) {
      RVar6 = SQRT(dVar9);
      goto LAB_0018197d;
    }
  }
  RVar6 = sqrt(dVar9);
LAB_0018197d:
  *distance = RVar6;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_search_dist3(REF_DBL *a, REF_DBL *b, REF_DBL *c,
                                    REF_DBL *p, REF_DBL *distance) {
  REF_DBL ab[3], ac[3], ap[3];
  REF_DBL d1, d2;
  REF_DBL bp[3];
  REF_DBL d3, d4;
  REF_DBL vc, v;
  REF_DBL proj[3];
  REF_DBL cp[3];
  REF_DBL d5, d6;
  REF_DBL vb, va;
  REF_DBL w;

  /*
        printf("REF_DBL xyz0[]={%.15e, %.15e, %.15e};\n",a[0],a[1],a[2]);
        printf("REF_DBL xyz1[]={%.15e, %.15e, %.15e};\n",b[0],b[1],b[2]);
        printf("REF_DBL xyz2[]={%.15e, %.15e, %.15e};\n",c[0],c[1],c[2]);
        printf("REF_DBL xyz[]={%.15e, %.15e, %.15e};\n",p[0],p[1],p[2]);
   */

  /* Check if P in vertex region outside A */
  ab[0] = b[0] - a[0];
  ab[1] = b[1] - a[1];
  ab[2] = b[2] - a[2];

  ac[0] = c[0] - a[0];
  ac[1] = c[1] - a[1];
  ac[2] = c[2] - a[2];

  ap[0] = p[0] - a[0];
  ap[1] = p[1] - a[1];
  ap[2] = p[2] - a[2];

  d1 = ab[0] * ap[0] + ab[1] * ap[1] + ab[2] * ap[2];
  d2 = ac[0] * ap[0] + ac[1] * ap[1] + ac[2] * ap[2];
  if (d1 <= 0.0 && d2 <= 0.0) {
    *distance =
        sqrt((p[0] - a[0]) * (p[0] - a[0]) + (p[1] - a[1]) * (p[1] - a[1]) +
             (p[2] - a[2]) * (p[2] - a[2]));
    return REF_SUCCESS;
  }

  /* Check if P in vertex region outside B */
  bp[0] = p[0] - b[0];
  bp[1] = p[1] - b[1];
  bp[2] = p[2] - b[2];

  d3 = ab[0] * bp[0] + ab[1] * bp[1] + ab[2] * bp[2];
  d4 = ac[0] * bp[0] + ac[1] * bp[1] + ac[2] * bp[2];
  if (d3 >= 0.0 && d4 <= d3) {
    *distance =
        sqrt((p[0] - b[0]) * (p[0] - b[0]) + (p[1] - b[1]) * (p[1] - b[1]) +
             (p[2] - b[2]) * (p[2] - b[2]));
    return REF_SUCCESS;
  }

  /* Check if P in edge region of AB, if so return projection of P onto AB */
  vc = d1 * d4 - d3 * d2;
  if (vc <= 0.0 && d1 >= 0.0 && d3 <= 0.0) {
    RAS(ref_math_divisible(d1, (d1 - d3)), "div zero d1/(d1-d3)");
    v = d1 / (d1 - d3);
    proj[0] = a[0] + v * ab[0];
    proj[1] = a[1] + v * ab[1];
    proj[2] = a[2] + v * ab[2];
    *distance = sqrt((p[0] - proj[0]) * (p[0] - proj[0]) +
                     (p[1] - proj[1]) * (p[1] - proj[1]) +
                     (p[2] - proj[2]) * (p[2] - proj[2]));
    return REF_SUCCESS;
  }

  /* Check if P in vertex region outside C */
  cp[0] = p[0] - c[0];
  cp[1] = p[1] - c[1];
  cp[2] = p[2] - c[2];
  d5 = ab[0] * cp[0] + ab[1] * cp[1] + ab[2] * cp[2];
  d6 = ac[0] * cp[0] + ac[1] * cp[1] + ac[2] * cp[2];
  if (d6 >= 0.0 && d5 <= d6) {
    *distance =
        sqrt((p[0] - c[0]) * (p[0] - c[0]) + (p[1] - c[1]) * (p[1] - c[1]) +
             (p[2] - c[2]) * (p[2] - c[2]));
    return REF_SUCCESS;
  }

  /* Check if P in edge region of AC, if so return projection of P onto AC */
  vb = d5 * d2 - d1 * d6;
  if (vb <= 0.0 && d2 >= 0.0 && d6 <= 0.0) {
    RAS(ref_math_divisible(d2, (d2 - d6)), "div zero d2/(d2-d6)");
    v = d2 / (d2 - d6);
    proj[0] = a[0] + v * ac[0];
    proj[1] = a[1] + v * ac[1];
    proj[2] = a[2] + v * ac[2];
    *distance = sqrt((p[0] - proj[0]) * (p[0] - proj[0]) +
                     (p[1] - proj[1]) * (p[1] - proj[1]) +
                     (p[2] - proj[2]) * (p[2] - proj[2]));
    return REF_SUCCESS;
  }

  /* Check if P in edge region of BC, if so return projection of P onto BC */
  va = d3 * d6 - d5 * d4;
  if (va <= 0.0 && (d4 - d3) >= 0.0 && (d5 - d6) >= 0.0) {
    RAS(ref_math_divisible((d4 - d3), ((d4 - d3) + (d5 - d6))),
        "div zero (d4 - d3) / ((d4 - d3) + (d5 - d6))");
    v = (d4 - d3) / ((d4 - d3) + (d5 - d6));
    proj[0] = b[0] + v * (c[0] - b[0]);
    proj[1] = b[1] + v * (c[1] - b[1]);
    proj[2] = b[2] + v * (c[2] - b[2]);
    *distance = sqrt((p[0] - proj[0]) * (p[0] - proj[0]) +
                     (p[1] - proj[1]) * (p[1] - proj[1]) +
                     (p[2] - proj[2]) * (p[2] - proj[2]));
    return REF_SUCCESS;
  }

  RAS(ref_math_divisible(vb, (va + vb + vc)), "div zero vb / (va + vb + vc)");
  v = vb / (va + vb + vc);
  RAS(ref_math_divisible(vc, (va + vb + vc)), "div zero vc / (va + vb + vc)");
  w = vc / (va + vb + vc);
  proj[0] = a[0] + v * ab[0] + w * ac[0];
  proj[1] = a[1] + v * ab[1] + w * ac[1];
  proj[2] = a[2] + v * ab[2] + w * ac[2];
  *distance = sqrt((p[0] - proj[0]) * (p[0] - proj[0]) +
                   (p[1] - proj[1]) * (p[1] - proj[1]) +
                   (p[2] - proj[2]) * (p[2] - proj[2]));

  return REF_SUCCESS;
}